

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

Pass * wasm::createSimplifyLocalsNoTeeNoStructurePass(void)

{
  SimplifyLocals<false,_false,_true> *this;
  
  this = (SimplifyLocals<false,_false,_true> *)operator_new(0x398);
  memset(this,0,0x398);
  SimplifyLocals<false,_false,_true>::SimplifyLocals(this);
  return (Pass *)this;
}

Assistant:

Pass* createSimplifyLocalsNoTeeNoStructurePass() {
  return new SimplifyLocals<false, false>();
}